

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O0

void __thiscall
LINAnalyzerResults::GenerateBubbleText
          (LINAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  string *local_2b0;
  string *local_270;
  char local_268 [8];
  char seq_str_1 [128];
  char seq_str [128];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [8];
  string fault_str;
  char local_d8 [8];
  char number_str [128];
  Frame local_50 [8];
  Frame frame;
  ulonglong local_40;
  long local_38;
  char local_30;
  byte local_2f;
  DisplayBase display_base_local;
  Channel *channel_local;
  U64 frame_index_local;
  LINAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_50);
  std::__cxx11::string::string(local_f8);
  local_270 = local_158;
  do {
    std::__cxx11::string::string(local_270);
    local_270 = local_270 + 0x20;
  } while (local_270 != local_f8);
  if ((local_2f & 1) != 0) {
    std::__cxx11::string::operator+=(local_f8,"!FRAME");
  }
  if ((local_2f & 2) != 0) {
    std::__cxx11::string::operator+=(local_f8,"!BREAK");
  }
  if ((local_2f & 4) != 0) {
    std::__cxx11::string::operator+=(local_f8,"!SYNC");
  }
  if ((local_2f & 8) != 0) {
    std::__cxx11::string::operator+=(local_f8,"!CHK");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    AnalyzerHelpers::GetNumberString(local_40,display_base,8,local_d8,0x80);
    switch(local_30) {
    default:
      std::__cxx11::string::operator+=(local_158,"IBS");
      std::__cxx11::string::operator+=(local_138,"IB Space");
      std::__cxx11::string::operator+=(local_118,"Inter-Byte Space");
      break;
    case '\x01':
      std::__cxx11::string::operator+=(local_158,"BRK");
      std::__cxx11::string::operator+=(local_138,"Break");
      std::__cxx11::string::operator+=(local_118,"Header Break");
      break;
    case '\x02':
      std::__cxx11::string::operator+=(local_158,"SYN");
      std::__cxx11::string::operator+=(local_138,"Sync");
      std::__cxx11::string::operator+=(local_118,"Header Sync");
      break;
    case '\x03':
      AnalyzerHelpers::GetNumberString((ulong)((uint)local_40 & 0x3f),display_base,8,local_d8,0x80);
      std::__cxx11::string::operator+=(local_158,local_d8);
      std::__cxx11::string::operator+=(local_138,"PID: ");
      std::__cxx11::string::operator+=(local_138,local_d8);
      std::__cxx11::string::operator+=(local_118,"Protected ID: ");
      std::__cxx11::string::operator+=(local_118,local_d8);
      break;
    case '\x04':
    case '\x05':
      AnalyzerHelpers::GetNumberString(local_38 - 1,Decimal,8,seq_str_1 + 0x78,0x80);
      std::__cxx11::string::operator+=(local_158,local_d8);
      std::__cxx11::string::operator+=(local_138,"D");
      std::__cxx11::string::operator+=(local_138,seq_str_1 + 0x78);
      std::__cxx11::string::operator+=(local_138,": ");
      std::__cxx11::string::operator+=(local_138,local_d8);
      std::__cxx11::string::operator+=(local_118,"Data ");
      std::__cxx11::string::operator+=(local_118,seq_str_1 + 0x78);
      std::__cxx11::string::operator+=(local_118,": ");
      std::__cxx11::string::operator+=(local_118,local_d8);
      break;
    case '\x06':
      std::__cxx11::string::operator+=(local_158,local_d8);
      std::__cxx11::string::operator+=(local_138,"CHK: ");
      std::__cxx11::string::operator+=(local_138,local_d8);
      std::__cxx11::string::operator+=(local_118,"Checksum: ");
      std::__cxx11::string::operator+=(local_118,local_d8);
      break;
    case '\a':
      bVar1 = IsFrameChecksum(this,frame_index);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_158,local_d8);
        std::__cxx11::string::operator+=(local_138,"CHK: ");
        std::__cxx11::string::operator+=(local_138,local_d8);
        std::__cxx11::string::operator+=(local_118,"Checksum: ");
        std::__cxx11::string::operator+=(local_118,local_d8);
      }
      else {
        AnalyzerHelpers::GetNumberString(local_38 - 1,Decimal,8,local_268,0x80);
        std::__cxx11::string::operator+=(local_158,local_d8);
        std::__cxx11::string::operator+=(local_138,"D");
        std::__cxx11::string::operator+=(local_138,local_268);
        std::__cxx11::string::operator+=(local_138,": ");
        std::__cxx11::string::operator+=(local_138,local_d8);
        std::__cxx11::string::operator+=(local_118,"Data ");
        std::__cxx11::string::operator+=(local_118,local_268);
        std::__cxx11::string::operator+=(local_118,": ");
        std::__cxx11::string::operator+=(local_118,local_d8);
      }
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    std::__cxx11::string::operator+=(local_f8,"!");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((local_30 == '\x06') && (local_2f == 8)) {
      AnalyzerHelpers::GetNumberString(local_40,display_base,8,local_d8,0x80);
      std::__cxx11::string::operator=(local_158,"!CHK ERR: ");
      std::__cxx11::string::operator+=(local_158,local_d8);
      std::__cxx11::string::operator=(local_138,"!Checksum mismatch: ");
      std::__cxx11::string::operator+=(local_138,local_d8);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  local_2b0 = local_f8;
  do {
    local_2b0 = local_2b0 + -0x20;
    std::__cxx11::string::~string(local_2b0);
  } while (local_2b0 != local_158);
  std::__cxx11::string::~string(local_f8);
  Frame::~Frame(local_50);
  return;
}

Assistant:

void LINAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    char number_str[ 128 ];
    std::string fault_str;
    std::string str[ 3 ];

    if( frame.mFlags & byteFramingError )
        fault_str += "!FRAME";
    if( frame.mFlags & headerBreakExpected )
        fault_str += "!BREAK";
    if( frame.mFlags & headerSyncExpected )
        fault_str += "!SYNC";
    if( frame.mFlags & checksumMismatch )
        fault_str += "!CHK";
    if( fault_str.length() )
    {
        fault_str += "!";
        AddResultString( fault_str.c_str() );

        // display the error checksum if and only if the frame was a checksum and the only error was a checksum mismatch.
        if( ( frame.mType == ( U8 )LINAnalyzerResults::responseChecksum ) && ( frame.mFlags == checksumMismatch ) )
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
            str[ 0 ] = "!CHK ERR: ";
            str[ 0 ] += number_str;
            str[ 1 ] = "!Checksum mismatch: ";
            str[ 1 ] += number_str;
            AddResultString( str[ 0 ].c_str() );
            AddResultString( str[ 1 ].c_str() );
        }
    }
    else
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        switch( ( LINAnalyzerResults::tLINFrameState )frame.mType )
        {
        default:
        case LINAnalyzerResults::NoFrame:
            str[ 0 ] += "IBS";
            str[ 1 ] += "IB Space";
            str[ 2 ] += "Inter-Byte Space";
            // AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, str, 128 );
            break;
        case LINAnalyzerResults::headerBreak: // expecting break.
            str[ 0 ] += "BRK";
            str[ 1 ] += "Break";
            str[ 2 ] += "Header Break";
            break;
        case LINAnalyzerResults::headerSync: // expecting sync.
            str[ 0 ] += "SYN";
            str[ 1 ] += "Sync";
            str[ 2 ] += "Header Sync";
            break;
        case LINAnalyzerResults::headerPID: // expecting PID.
            AnalyzerHelpers::GetNumberString( frame.mData1 & 0x3F, display_base, 8, number_str, 128 );
            str[ 0 ] += number_str;

            str[ 1 ] += "PID: ";
            str[ 1 ] += number_str;

            str[ 2 ] += "Protected ID: ";
            str[ 2 ] += number_str;
            break;
        // LIN Response
        case LINAnalyzerResults::responseDataZero: // expecting first resppnse data byte.
        case LINAnalyzerResults::responseData:     // expecting response data.
        {
            char seq_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
            str[ 0 ] += number_str;
            str[ 1 ] += "D";
            str[ 1 ] += seq_str;
            str[ 1 ] += ": ";
            str[ 1 ] += number_str;
            str[ 2 ] += "Data ";
            str[ 2 ] += seq_str;
            str[ 2 ] += ": ";
            str[ 2 ] += number_str;
        }
        break;
        case LINAnalyzerResults::responseChecksum: // expecting checksum.
            str[ 0 ] += number_str;
            str[ 1 ] += "CHK: ";
            str[ 1 ] += number_str;
            str[ 2 ] += "Checksum: ";
            str[ 2 ] += number_str;
            break;

        case LINAnalyzerResults::responsePotentialChecksum:
            if( IsFrameChecksum( frame_index ) )
            {
                str[ 0 ] += number_str;
                str[ 1 ] += "CHK: ";
                str[ 1 ] += number_str;
                str[ 2 ] += "Checksum: ";
                str[ 2 ] += number_str;
            }
            else
            {
                char seq_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
                str[ 0 ] += number_str;
                str[ 1 ] += "D";
                str[ 1 ] += seq_str;
                str[ 1 ] += ": ";
                str[ 1 ] += number_str;
                str[ 2 ] += "Data ";
                str[ 2 ] += seq_str;
                str[ 2 ] += ": ";
                str[ 2 ] += number_str;
            }

            break;
        }

        AddResultString( str[ 0 ].c_str() );
        AddResultString( str[ 1 ].c_str() );
        AddResultString( str[ 2 ].c_str() );
    }
}